

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crail_directory.cc
# Opt level: O1

int __thiscall CrailDirectory::Enumerate(CrailDirectory *this)

{
  char *__s;
  size_t sVar1;
  uint uVar2;
  ulong uVar3;
  unique_ptr<CrailInputstream,_std::default_delete<CrailInputstream>_> input_stream;
  shared_ptr<crail::ByteBuffer> buf;
  DirectoryRecord record;
  shared_ptr<NamenodeClient> local_90;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  Future<int> local_78;
  shared_ptr<crail::ByteBuffer> local_58;
  DirectoryRecord local_48;
  
  uVar3 = (this->super_CrailNode).file_info_.capacity_;
  local_78.super_AsyncTask<int>._vptr_AsyncTask =
       local_78.super_AsyncTask<int>._vptr_AsyncTask & 0xffffffff00000000;
  std::
  make_unique<CrailInputstream,std::shared_ptr<NamenodeClient>&,std::shared_ptr<StorageCache>&,std::shared_ptr<BlockCache>&,FileInfo&,int>
            (&local_90,(shared_ptr<StorageCache> *)&(this->super_CrailNode).namenode_client_,
             (shared_ptr<BlockCache> *)&(this->super_CrailNode).storage_cache_,
             (FileInfo *)&(this->super_CrailNode).block_cache_,
             (int *)&(this->super_CrailNode).file_info_);
  local_78.super_AsyncTask<int>._vptr_AsyncTask._0_4_ = 0x200;
  local_90.super___shared_ptr<NamenodeClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<crail::ByteBuffer,std::allocator<crail::ByteBuffer>,int>
            (&local_80,
             (ByteBuffer **)
             &local_90.super___shared_ptr<NamenodeClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (allocator<crail::ByteBuffer> *)&local_48,(int *)&local_78);
  DirectoryRecord::DirectoryRecord(&local_48);
  uVar3 = uVar3 >> 9;
  if (0 < (int)uVar3) {
    do {
      (local_90.super___shared_ptr<NamenodeClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_weak_count = 0;
      *(_Atomic_word *)
       &local_90.super___shared_ptr<NamenodeClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1]
        ._vptr__Sp_counted_base =
           (local_90.super___shared_ptr<NamenodeClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count;
      local_58.super___shared_ptr<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           local_90.super___shared_ptr<NamenodeClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      local_58.super___shared_ptr<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           local_80._M_pi;
      if (local_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_80._M_pi)->_M_use_count = (local_80._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_80._M_pi)->_M_use_count = (local_80._M_pi)->_M_use_count + 1;
        }
      }
      CrailInputstream::Read
                (&local_78,
                 (CrailInputstream *)
                 local_90.super___shared_ptr<NamenodeClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 &local_58);
      if ((local_78.is_done_ == false) &&
         (local_78.task_.super___shared_ptr<AsyncTask<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0)) {
        local_78.result_ =
             (**(local_78.task_.super___shared_ptr<AsyncTask<int>,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_vptr_AsyncTask)();
        local_78.is_done_ = true;
      }
      local_78.super_AsyncTask<int>._vptr_AsyncTask = (_func_int **)&PTR_get_001302e8;
      if (local_78.task_.super___shared_ptr<AsyncTask<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.task_.super___shared_ptr<AsyncTask<int>,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_58.super___shared_ptr<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_58.super___shared_ptr<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      *(_Atomic_word *)
       &local_90.super___shared_ptr<NamenodeClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1]
        ._vptr__Sp_counted_base =
           (local_90.super___shared_ptr<NamenodeClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_weak_count;
      (local_90.super___shared_ptr<NamenodeClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_weak_count = 0;
      DirectoryRecord::Update
                (&local_48,
                 (ByteBuffer *)
                 local_90.super___shared_ptr<NamenodeClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi);
      if (local_48.valid_ != 0) {
        __s = (char *)std::string::_Rep::_M_grab
                                ((allocator *)
                                 ((long)*(_Alloc_hider *)
                                         local_48.name_._M_t.
                                         super___uniq_ptr_impl<std::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl + -0x18),(allocator *)&local_78);
        if (__s == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x133178);
        }
        else {
          sVar1 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar1);
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
        std::ostream::put('x');
        std::ostream::flush();
        std::string::_Rep::_M_dispose((allocator *)(__s + -0x18));
      }
      uVar2 = (int)uVar3 - 1;
      uVar3 = (ulong)uVar2;
    } while (uVar2 != 0);
  }
  DirectoryRecord::~DirectoryRecord(&local_48);
  if (local_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80._M_pi);
  }
  if ((CrailInputstream *)
      local_90.super___shared_ptr<NamenodeClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (CrailInputstream *)0x0) {
    (*(local_90.super___shared_ptr<NamenodeClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_NamenodeClient[1])();
  }
  return 0;
}

Assistant:

int CrailDirectory::Enumerate() {
  int records = file_info_.capacity() / 512;
  unique_ptr<CrailInputstream> input_stream = make_unique<CrailInputstream>(
      namenode_client_, storage_cache_, block_cache_, file_info_, 0);
  shared_ptr<ByteBuffer> buf = make_shared<ByteBuffer>(512);
  DirectoryRecord record;
  for (int i = 0; i < records; i++) {
    buf->Clear();
    input_stream->Read(buf).get();
    buf->Flip();
    record.Update(*buf);
    if (record.valid()) {
      cout << record.name().c_str() << endl;
    }
  }

  return 0;
}